

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O1

void cleanTrailer(QPDFObjectHandle *trailer)

{
  char cVar1;
  int iVar2;
  string id0;
  QPDFObjectHandle id;
  string id1;
  char local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50 [2];
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  long local_20 [2];
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/Length","");
  QPDFObjectHandle::removeKey((string *)trailer);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/ID","");
  QPDFObjectHandle::getKey(local_40);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 == '\0') goto LAB_001042d6;
  iVar2 = QPDFObjectHandle::getArrayNItems();
  if (iVar2 != 2) goto LAB_001042d6;
  QPDFObjectHandle::getArrayItem((int)&local_30);
  QPDFObjectHandle::unparse_abi_cxx11_();
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  QPDFObjectHandle::getArrayItem((int)local_70);
  QPDFObjectHandle::unparse_abi_cxx11_();
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  operator____qpdf(local_70,0x106271);
  QPDFObjectHandle::setArrayItem((int)local_40,(QPDFObjectHandle *)0x1);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 == local_28) {
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = bcmp(local_60,local_30,(size_t)local_58);
      if (iVar2 != 0) goto LAB_001042a4;
    }
    operator____qpdf(local_70,0x106271);
    QPDFObjectHandle::setArrayItem((int)local_40,(QPDFObjectHandle *)0x0);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
  }
LAB_001042a4:
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
LAB_001042d6:
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

void
cleanTrailer(QPDFObjectHandle& trailer)
{
    // If the trailer is an object stream, it will have /Length.
    trailer.removeKey("/Length");
    // Disregard the second half of /ID. This doesn't have anything directly to do with zlib, but
    // lots of tests use --deterministic-id, and that is affected. The deterministic ID tests
    // meaningfully exercise that deterministic IDs behave as expected, so for the rest of the
    // tests, it's okay to ignore /ID[1]. If the two halves of /ID are the same, ignore both since
    // this means qpdf completely generated the /ID rather than preserving the first half.
    auto id = trailer.getKey("/ID");
    if (id.isArray() && id.getArrayNItems() == 2) {
        auto id0 = id.getArrayItem(0).unparse();
        auto id1 = id.getArrayItem(1).unparse();
        id.setArrayItem(1, "()"_qpdf);
        if (id0 == id1) {
            id.setArrayItem(0, "()"_qpdf);
        }
    }
}